

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

int __thiscall
cmCTestBuildHandler::RunMakeCommand
          (cmCTestBuildHandler *this,string *command,int *retVal,char *dir,int timeout,ostream *ofs,
          Encoding encoding)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmCTest *pcVar4;
  cmCTestBuildHandler *pcVar5;
  pointer ppcVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  cmsysProcess *pcVar10;
  ostream *poVar11;
  t_BuildProcessingQueueType *queue;
  long *plVar12;
  long lVar13;
  char *pcVar14;
  _Alloc_hider _Var15;
  pointer ppcVar16;
  string *arg;
  pointer pbVar17;
  bool bVar18;
  cmProcessOutput processOutput;
  size_type tick;
  int length;
  string strdata;
  cmCTestBuildErrorWarning errorwarning;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  char *data;
  ostringstream cmCTestLog_msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  LaunchHelper launchHelper;
  cmProcessOutput local_361;
  cmsysProcess *local_360;
  cmCTestBuildHandler *local_358;
  int *local_350;
  t_BuildProcessingQueueType *local_348;
  ostream *local_340;
  size_t local_338;
  int local_32c;
  string local_328;
  cmCTestBuildErrorWarning local_308;
  vector<const_char_*,_std::allocator<const_char_*>_> local_258;
  t_ErrorsAndWarningsVector *local_240;
  char *local_238;
  undefined1 local_230 [16];
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c0;
  size_type local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [13];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  long *local_a0;
  long local_90 [2];
  string local_80;
  string local_60;
  LaunchHelper local_40;
  
  local_350 = retVal;
  local_340 = ofs;
  cmSystemTools::ParseArguments(&local_b8,command);
  if (local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar7 = 0;
    goto LAB_001637c2;
  }
  local_348 = (t_BuildProcessingQueueType *)CONCAT44(local_348._4_4_,timeout);
  local_258.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (char **)0x0;
  local_258.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (char **)0x0;
  local_258.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_360 = (cmsysProcess *)dir;
  local_358 = this;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&local_258,
             ((long)local_b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  if (local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar17 = local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_230._0_8_ = (pbVar17->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_258,(char **)local_230);
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 !=
             local_b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_230._0_8_ = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_258,(char **)local_230);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
  pcVar5 = local_358;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"Run command:",0xc);
  pcVar4 = (pcVar5->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x315,(char *)CONCAT44(local_308.LogLine,local_308._0_4_),
               (pcVar5->super_cmCTestGenericHandler).Quiet);
  if ((size_type *)CONCAT44(local_308.LogLine,local_308._0_4_) != &local_308.Text._M_string_length)
  {
    operator_delete((undefined1 *)CONCAT44(local_308.LogLine,local_308._0_4_),
                    local_308.Text._M_string_length + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
  std::ios_base::~ios_base((ios_base *)&local_1c0);
  ppcVar6 = local_258.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pcVar5 = local_358;
  if (local_258.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_258.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar16 = local_258.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      pcVar14 = *ppcVar16;
      if (pcVar14 == (char *)0x0) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230," \"",2);
      sVar9 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar14,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\"",1);
      pcVar4 = (pcVar5->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x31b,(char *)CONCAT44(local_308.LogLine,local_308._0_4_),
                   (pcVar5->super_cmCTestGenericHandler).Quiet);
      if ((size_type *)CONCAT44(local_308.LogLine,local_308._0_4_) !=
          &local_308.Text._M_string_length) {
        operator_delete((undefined1 *)CONCAT44(local_308.LogLine,local_308._0_4_),
                        local_308.Text._M_string_length + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
      std::ios_base::~ios_base((ios_base *)&local_1c0);
      ppcVar16 = ppcVar16 + 1;
    } while (ppcVar16 != ppcVar6);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
  pcVar5 = local_358;
  std::ios::widen((char)(ostringstream *)local_230 + (char)*(_func_int **)(local_230._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_230);
  std::ostream::flush();
  pcVar4 = (pcVar5->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x31e,(char *)CONCAT44(local_308.LogLine,local_308._0_4_),
               (pcVar5->super_cmCTestGenericHandler).Quiet);
  if ((size_type *)CONCAT44(local_308.LogLine,local_308._0_4_) != &local_308.Text._M_string_length)
  {
    operator_delete((undefined1 *)CONCAT44(local_308.LogLine,local_308._0_4_),
                    local_308.Text._M_string_length + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
  std::ios_base::~ios_base((ios_base *)&local_1c0);
  LaunchHelper::LaunchHelper(&local_40,pcVar5);
  pcVar10 = cmsysProcess_New();
  cmsysProcess_SetCommand
            (pcVar10,local_258.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(pcVar10,(char *)local_360);
  cmsysProcess_SetOption(pcVar10,0,1);
  cmsysProcess_SetTimeout(pcVar10,(double)(int)local_348);
  cmsysProcess_Execute(pcVar10);
  local_338 = 0;
  cmProcessOutput::cmProcessOutput(&local_361,encoding,0x400);
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_328._M_string_length = 0;
  local_328.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_230,"   Each symbol represents ",0x1a);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," bytes of output.",0x11);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  poVar11 = (ostream *)std::ostream::flush();
  pcVar14 = "   \'!\' represents an error and \'*\' a warning.\n";
  bVar18 = pcVar5->UseCTestLaunch != false;
  if (bVar18) {
    pcVar14 = "";
  }
  lVar13 = 0x2e;
  if (bVar18) {
    lVar13 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar14,lVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"    ",4);
  std::ostream::flush();
  pcVar4 = (pcVar5->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x33c,(char *)CONCAT44(local_308.LogLine,local_308._0_4_),
               (pcVar5->super_cmCTestGenericHandler).Quiet);
  local_360 = pcVar10;
  if ((size_type *)CONCAT44(local_308.LogLine,local_308._0_4_) != &local_308.Text._M_string_length)
  {
    operator_delete((undefined1 *)CONCAT44(local_308.LogLine,local_308._0_4_),
                    local_308.Text._M_string_length + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
  std::ios_base::~ios_base((ios_base *)&local_1c0);
  local_348 = &pcVar5->BuildProcessingQueue;
  std::deque<char,_std::allocator<char>_>::clear(local_348);
  pcVar5->OutputLineCounter = 0;
  local_240 = &pcVar5->ErrorsAndWarnings;
  std::
  vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
  ::_M_erase_at_end(local_240,
                    (pcVar5->ErrorsAndWarnings).
                    super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pcVar5->TotalErrors = 0;
  pcVar5->TotalWarnings = 0;
  pcVar5->BuildOutputLogSize = 0;
  pcVar5->LastTickChar = '.';
  pcVar5->ErrorQuotaReached = false;
  pcVar5->WarningQuotaReached = false;
  while (iVar7 = cmsysProcess_WaitForData(local_360,&local_238,&local_32c,(double *)0x0), iVar7 != 0
        ) {
    if (0 < local_32c) {
      lVar13 = 0;
      do {
        if (local_238[lVar13] == '\0') {
          local_238[lVar13] = '\n';
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < local_32c);
    }
    if (iVar7 == 3) {
      cmProcessOutput::DecodeText(&local_361,local_238,(long)local_32c,&local_328,1);
      queue = &pcVar5->BuildProcessingErrorQueue;
    }
    else {
      cmProcessOutput::DecodeText(&local_361,local_238,(long)local_32c,&local_328,2);
      queue = local_348;
    }
    ProcessBuffer(local_358,local_328._M_dataplus._M_p,local_328._M_string_length,&local_338,0x400,
                  local_340,queue);
  }
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  cmProcessOutput::DecodeText(&local_361,&local_60,&local_328,1);
  pcVar5 = local_358;
  pcVar10 = local_360;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  if (local_328._M_string_length != 0) {
    ProcessBuffer(pcVar5,local_328._M_dataplus._M_p,local_328._M_string_length,&local_338,0x400,
                  local_340,&pcVar5->BuildProcessingErrorQueue);
  }
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  cmProcessOutput::DecodeText(&local_361,&local_80,&local_328,2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  if (local_328._M_string_length != 0) {
    ProcessBuffer(pcVar5,local_328._M_dataplus._M_p,local_328._M_string_length,&local_338,0x400,
                  local_340,local_348);
  }
  ProcessBuffer(pcVar5,(char *)0x0,0,&local_338,0x400,local_340,local_348);
  ProcessBuffer(pcVar5,(char *)0x0,0,&local_338,0x400,local_340,&pcVar5->BuildProcessingErrorQueue);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230," Size of output: ",0x11);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"K",1);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  pcVar4 = (pcVar5->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x372,(char *)CONCAT44(local_308.LogLine,local_308._0_4_),
               (pcVar5->super_cmCTestGenericHandler).Quiet);
  if ((size_type *)CONCAT44(local_308.LogLine,local_308._0_4_) != &local_308.Text._M_string_length)
  {
    operator_delete((undefined1 *)CONCAT44(local_308.LogLine,local_308._0_4_),
                    local_308.Text._M_string_length + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
  std::ios_base::~ios_base((ios_base *)&local_1c0);
  cmsysProcess_WaitForExit(pcVar10,(double *)0x0);
  iVar7 = cmsysProcess_GetState(pcVar10);
  switch(iVar7) {
  case 1:
    local_308.Text._M_dataplus._M_p = (pointer)&local_308.Text.field_2;
    local_308.Text._M_string_length = 0;
    local_308.Text.field_2._M_local_buf[0] = '\0';
    local_308.SourceFile._M_dataplus._M_p = (pointer)&local_308.SourceFile.field_2;
    local_308.SourceFile._M_string_length = 0;
    local_308.SourceFile.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_308.SourceFileTail.field_2;
    local_308.SourceFileTail._M_string_length = 0;
    local_308.SourceFileTail.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_308.PreContext.field_2;
    local_308.PreContext._M_string_length = 0;
    local_308.PreContext.field_2._M_local_buf[0] = '\0';
    paVar3 = &local_308.PostContext.field_2;
    local_308.PostContext._M_string_length = 0;
    local_308.PostContext.field_2._M_local_buf[0] = '\0';
    local_308.LogLine = 1;
    local_308.SourceFileTail._M_dataplus._M_p = (pointer)paVar1;
    local_308.PreContext._M_dataplus._M_p = (pointer)paVar2;
    local_308.PostContext._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_replace((ulong)&local_308.Text,0,(char *)0x0,0x533a2e);
    cmsysProcess_GetErrorString(local_360);
    std::__cxx11::string::append((char *)&local_308.Text);
    local_308.PreContext._M_string_length = 0;
    *local_308.PreContext._M_dataplus._M_p = '\0';
    local_308.PostContext._M_string_length = 0;
    *local_308.PostContext._M_dataplus._M_p = '\0';
    local_308.Error = true;
    std::
    vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
    ::emplace_back<cmCTestBuildHandler::cmCTestBuildErrorWarning>(local_240,&local_308);
    local_358->TotalErrors = local_358->TotalErrors + 1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"There was an error: ",0x14);
    pcVar14 = cmsysProcess_GetErrorString(local_360);
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)(&stack0xfffffffffffffc88 +
                           (long)*(_func_int **)(local_230._0_8_ + -0x18)) + 0x148);
    }
    else {
      sVar9 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar14,sVar9);
    }
    std::ios::widen((char)(ostream *)local_230 + (char)*(_func_int **)(local_230._0_8_ + -0x18));
    std::ostream::put((char)local_230);
    std::ostream::flush();
    pcVar4 = (local_358->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x3a6,(char *)local_a0,false);
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
    std::ios_base::~ios_base((ios_base *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.PostContext._M_dataplus._M_p != paVar3) {
      operator_delete(local_308.PostContext._M_dataplus._M_p,
                      CONCAT71(local_308.PostContext.field_2._M_allocated_capacity._1_7_,
                               local_308.PostContext.field_2._M_local_buf[0]) + 1);
    }
    pcVar10 = local_360;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.PreContext._M_dataplus._M_p != paVar2) {
      operator_delete(local_308.PreContext._M_dataplus._M_p,
                      CONCAT71(local_308.PreContext.field_2._M_allocated_capacity._1_7_,
                               local_308.PreContext.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.SourceFileTail._M_dataplus._M_p != paVar1) {
      operator_delete(local_308.SourceFileTail._M_dataplus._M_p,
                      CONCAT71(local_308.SourceFileTail.field_2._M_allocated_capacity._1_7_,
                               local_308.SourceFileTail.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.SourceFile._M_dataplus._M_p != &local_308.SourceFile.field_2) {
      operator_delete(local_308.SourceFile._M_dataplus._M_p,
                      CONCAT71(local_308.SourceFile.field_2._M_allocated_capacity._1_7_,
                               local_308.SourceFile.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.Text._M_dataplus._M_p != &local_308.Text.field_2) {
      lVar13 = CONCAT71(local_308.Text.field_2._M_allocated_capacity._1_7_,
                        local_308.Text.field_2._M_local_buf[0]);
      _Var15._M_p = local_308.Text._M_dataplus._M_p;
LAB_00163762:
      operator_delete(_Var15._M_p,lVar13 + 1);
    }
    break;
  case 2:
    if (local_350 != (int *)0x0) {
      iVar8 = cmsysProcess_GetExitException(pcVar10);
      *local_350 = iVar8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_230,"There was an exception: ",0x18);
      plVar12 = (long *)std::ostream::operator<<(local_230,*local_350);
      std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
      std::ostream::put((char)plVar12);
      std::ostream::flush();
      pcVar4 = (pcVar5->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x394,(char *)CONCAT44(local_308.LogLine,local_308._0_4_),
                   (pcVar5->super_cmCTestGenericHandler).Quiet);
      goto LAB_001635a8;
    }
    break;
  case 4:
    if (local_350 != (int *)0x0) {
      iVar8 = cmsysProcess_GetExitValue(pcVar10);
      *local_350 = iVar8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_230,"Command exited with the value: ",0x1f);
      plVar12 = (long *)std::ostream::operator<<(local_230,*local_350);
      std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
      std::ostream::put((char)plVar12);
      std::ostream::flush();
      pcVar4 = (pcVar5->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x37e,(char *)CONCAT44(local_308.LogLine,local_308._0_4_),
                   (pcVar5->super_cmCTestGenericHandler).Quiet);
      if ((size_type *)CONCAT44(local_308.LogLine,local_308._0_4_) !=
          &local_308.Text._M_string_length) {
        operator_delete((undefined1 *)CONCAT44(local_308.LogLine,local_308._0_4_),
                        local_308.Text._M_string_length + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
      std::ios_base::~ios_base((ios_base *)&local_1c0);
      if (*local_350 != 0) {
        local_230._8_8_ = &local_218;
        local_220 = 0;
        local_218._M_local_buf[0] = '\0';
        local_200 = 0;
        local_1f8._M_local_buf[0] = '\0';
        local_1e0 = 0;
        local_1d8._M_local_buf[0] = '\0';
        local_1b8 = 0;
        local_1b0._M_local_buf[0] = '\0';
        local_198 = 0;
        local_190[0]._M_local_buf[0] = '\0';
        local_230._4_4_ = 1;
        local_208._M_p = (pointer)&local_1f8;
        local_1e8._M_p = (pointer)&local_1d8;
        local_1c0._M_p = (pointer)&local_1b0;
        local_1a0._M_p = (pointer)local_190;
        std::__cxx11::string::_M_replace((ulong)(local_230 + 8),0,(char *)0x0,0x53572a);
        std::__cxx11::string::append(local_230 + 8);
        local_1b8 = 0;
        *local_1c0._M_p = '\0';
        local_198 = 0;
        *local_1a0._M_p = '\0';
        local_230._0_8_ = local_230._0_8_ & 0xffffffffffffff00;
        std::
        vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
        ::emplace_back<cmCTestBuildHandler::cmCTestBuildErrorWarning>
                  (local_240,(cmCTestBuildErrorWarning *)local_230);
        local_358->TotalWarnings = local_358->TotalWarnings + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_p != local_190) {
          operator_delete(local_1a0._M_p,
                          CONCAT71(local_190[0]._M_allocated_capacity._1_7_,
                                   local_190[0]._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_p != &local_1b0) {
          operator_delete(local_1c0._M_p,
                          CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_p != &local_1d8) {
          operator_delete(local_1e8._M_p,
                          CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0])
                          + 1);
        }
        pcVar10 = local_360;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_p != &local_1f8) {
          operator_delete(local_208._M_p,
                          CONCAT71(local_1f8._M_allocated_capacity._1_7_,local_1f8._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._8_8_ != &local_218) {
          lVar13 = CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0]);
          _Var15._M_p = (pointer)local_230._8_8_;
          goto LAB_00163762;
        }
      }
    }
    break;
  case 5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"There was a timeout",0x13);
    std::ios::widen((char)(ostream *)local_230 + (char)*(_func_int **)(local_230._0_8_ + -0x18));
    std::ostream::put((char)local_230);
    std::ostream::flush();
    pcVar4 = (pcVar5->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x398,(char *)CONCAT44(local_308.LogLine,local_308._0_4_),
                 (pcVar5->super_cmCTestGenericHandler).Quiet);
LAB_001635a8:
    if ((size_type *)CONCAT44(local_308.LogLine,local_308._0_4_) != &local_308.Text._M_string_length
       ) {
      operator_delete((undefined1 *)CONCAT44(local_308.LogLine,local_308._0_4_),
                      local_308.Text._M_string_length + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
    std::ios_base::~ios_base((ios_base *)&local_1c0);
  }
  cmsysProcess_Delete(pcVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,
                    CONCAT71(local_328.field_2._M_allocated_capacity._1_7_,
                             local_328.field_2._M_local_buf[0]) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_361);
  LaunchHelper::~LaunchHelper(&local_40);
  if (local_258.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (char **)0x0) {
    operator_delete(local_258.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_001637c2:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return iVar7;
}

Assistant:

int cmCTestBuildHandler::RunMakeCommand(const std::string& command,
                                        int* retVal, const char* dir,
                                        int timeout, std::ostream& ofs,
                                        Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  std::vector<const char*> argv;
  argv.reserve(args.size() + 1);
  for (std::string const& arg : args) {
    argv.push_back(arg.c_str());
  }
  argv.push_back(nullptr);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Run command:", this->Quiet);
  for (char const* arg : argv) {
    if (!arg) {
      break;
    }
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " \"" << arg << "\"", this->Quiet);
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
                     this->Quiet);

  // Optionally use make rule launchers to record errors and warnings.
  LaunchHelper launchHelper(this);
  static_cast<void>(launchHelper);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  // Initialize tick's
  std::string::size_type tick = 0;
  const std::string::size_type tick_len = 1024;

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  cmCTestOptionalLog(
    this->CTest, HANDLER_PROGRESS_OUTPUT,
    "   Each symbol represents "
      << tick_len << " bytes of output." << std::endl
      << (this->UseCTestLaunch
            ? ""
            : "   '!' represents an error and '*' a warning.\n")
      << "    " << std::flush,
    this->Quiet);

  // Initialize building structures
  this->BuildProcessingQueue.clear();
  this->OutputLineCounter = 0;
  this->ErrorsAndWarnings.clear();
  this->TotalErrors = 0;
  this->TotalWarnings = 0;
  this->BuildOutputLogSize = 0;
  this->LastTickChar = '.';
  this->WarningQuotaReached = false;
  this->ErrorQuotaReached = false;

  // For every chunk of data
  int res;
  while ((res = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    // Replace '\0' with '\n', since '\0' does not really make sense. This is
    // for Visual Studio output
    for (int cc = 0; cc < length; ++cc) {
      if (data[cc] == 0) {
        data[cc] = '\n';
      }
    }

    // Process the chunk of data
    if (res == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 1);
      this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                          &this->BuildProcessingErrorQueue);
    } else {
      processOutput.DecodeText(data, length, strdata, 2);
      this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                          &this->BuildProcessingQueue);
    }
  }
  processOutput.DecodeText(std::string(), strdata, 1);
  if (!strdata.empty()) {
    this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                        &this->BuildProcessingErrorQueue);
  }
  processOutput.DecodeText(std::string(), strdata, 2);
  if (!strdata.empty()) {
    this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                        &this->BuildProcessingQueue);
  }

  this->ProcessBuffer(nullptr, 0, tick, tick_len, ofs,
                      &this->BuildProcessingQueue);
  this->ProcessBuffer(nullptr, 0, tick, tick_len, ofs,
                      &this->BuildProcessingErrorQueue);
  cmCTestOptionalLog(this->CTest, HANDLER_PROGRESS_OUTPUT,
                     " Size of output: "
                       << ((this->BuildOutputLogSize + 512) / 1024) << "K"
                       << std::endl,
                     this->Quiet);

  // Properly handle output of the build command
  cmsysProcess_WaitForExit(cp, nullptr);
  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Command exited with the value: " << *retVal
                                                           << std::endl,
                         this->Quiet);
      // if a non zero return value
      if (*retVal) {
        // If there was an error running command, report that on the
        // dashboard.
        cmCTestBuildErrorWarning errorwarning;
        errorwarning.LogLine = 1;
        errorwarning.Text =
          "*** WARNING non-zero return value in ctest from: ";
        errorwarning.Text += argv[0];
        errorwarning.PreContext.clear();
        errorwarning.PostContext.clear();
        errorwarning.Error = false;
        this->ErrorsAndWarnings.push_back(std::move(errorwarning));
        this->TotalWarnings++;
      }
    }
  } else if (result == cmsysProcess_State_Exception) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitException(cp);
      cmCTestOptionalLog(this->CTest, WARNING,
                         "There was an exception: " << *retVal << std::endl,
                         this->Quiet);
    }
  } else if (result == cmsysProcess_State_Expired) {
    cmCTestOptionalLog(this->CTest, WARNING,
                       "There was a timeout" << std::endl, this->Quiet);
  } else if (result == cmsysProcess_State_Error) {
    // If there was an error running command, report that on the dashboard.
    cmCTestBuildErrorWarning errorwarning;
    errorwarning.LogLine = 1;
    errorwarning.Text = "*** ERROR executing: ";
    errorwarning.Text += cmsysProcess_GetErrorString(cp);
    errorwarning.PreContext.clear();
    errorwarning.PostContext.clear();
    errorwarning.Error = true;
    this->ErrorsAndWarnings.push_back(std::move(errorwarning));
    this->TotalErrors++;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "There was an error: " << cmsysProcess_GetErrorString(cp)
                                      << std::endl);
  }

  cmsysProcess_Delete(cp);
  return result;
}